

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<int>::InternalDeallocate<true>(RepeatedField<int> *this)

{
  int iVar1;
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *paVar2;
  HeapRep *pHVar3;
  anon_union_8_2_4f9aec01_for_ShortSooRep_1 in_RSI;
  RepeatedField<int> *this_00;
  RepeatedField<int> local_20;
  
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    this_00 = &local_20;
    InternalDeallocate<true>(this_00);
    (this_00->soo_rep_).field_0.long_rep.elements_int = 0;
    (this_00->soo_rep_).field_0.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
    this_00[1].soo_rep_.field_0.long_rep.elements_int = 0;
    this_00[1].soo_rep_.field_0.short_rep.field_1 = in_RSI;
    this_00[2].soo_rep_.field_0.long_rep.elements_int = 0;
    this_00[2].soo_rep_.field_0.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
    this_00[3].soo_rep_.field_0.long_rep.elements_int = (uintptr_t)in_RSI;
    this_00[3].soo_rep_.field_0.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
    this_00[4].soo_rep_.field_0.long_rep.elements_int = 0;
    this_00[4].soo_rep_.field_0.short_rep.field_1 = in_RSI;
    this_00[5].soo_rep_.field_0.long_rep.elements_int = 0;
    this_00[5].soo_rep_.field_0.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
    this_00[6].soo_rep_.field_0.long_rep.elements_int = (uintptr_t)in_RSI;
    this_00[6].soo_rep_.field_0.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
    this_00[7].soo_rep_.field_0.long_rep.elements_int = 0;
    this_00[7].soo_rep_.field_0.short_rep.field_1 = in_RSI;
    RepeatedField(this_00 + 8);
    RepeatedField(this_00 + 9,in_RSI);
    this_00[10].soo_rep_.field_0.long_rep.elements_int =
         (uintptr_t)&internal::fixed_address_empty_string_abi_cxx11_;
    this_00[10].soo_rep_.field_0.short_rep.field_1 =
         (anon_union_8_2_4f9aec01_for_ShortSooRep_1)&internal::fixed_address_empty_string_abi_cxx11_
    ;
    this_00[0xb].soo_rep_.field_0.long_rep.elements_int =
         (uintptr_t)&internal::fixed_address_empty_string_abi_cxx11_;
    return;
  }
  iVar1 = (this->soo_rep_).field_0.long_rep.capacity;
  paVar2 = &heap_rep(this)->field_0;
  if (paVar2->arena != (Arena *)0x0) {
    return;
  }
  pHVar3 = heap_rep(this);
  operator_delete(pHVar3,(long)iVar1 * 4 + 8);
  return;
}

Assistant:

bool is_soo() const { return (arena_and_size & kNotSooBit) == 0; }